

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O2

int Abc_SclFindBestCell(SC_Man *p,Abc_Obj_t *pObj,Vec_Int_t *vRecalcs,Vec_Int_t *vEvals,int Notches,
                       int DelayGap,float *pGainBest)

{
  Abc_Ntk_t *pAVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  SC_Cell *pOld;
  Abc_Obj_t *pAVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  SC_Cell *pCell;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_6c;
  int local_68;
  
  pOld = Abc_SclObjCell(pObj);
  p->vTimes2->nSize = 0;
  for (iVar6 = 0; iVar6 < vRecalcs->nSize; iVar6 = iVar6 + 1) {
    pAVar1 = p->pNtk;
    iVar3 = Vec_IntEntry(vRecalcs,iVar6);
    pAVar5 = Abc_NtkObj(pAVar1,iVar3);
    if (pAVar5 != (Abc_Obj_t *)0x0) {
      Vec_FltPush(p->vTimes2,p->pTimes[(uint)pAVar5->Id].rise);
      Vec_FltPush(p->vTimes2,p->pTimes[(uint)pAVar5->Id].fall);
      Vec_FltPush(p->vTimes2,p->pSlews[(uint)pAVar5->Id].rise);
      Vec_FltPush(p->vTimes2,p->pSlews[(uint)pAVar5->Id].fall);
    }
  }
  p->vTimes3->nSize = 0;
  for (iVar6 = 0; iVar6 < vEvals->nSize; iVar6 = iVar6 + 1) {
    pAVar1 = p->pNtk;
    iVar3 = Vec_IntEntry(vEvals,iVar6);
    pAVar5 = Abc_NtkObj(pAVar1,iVar3);
    if (pAVar5 != (Abc_Obj_t *)0x0) {
      Vec_FltPush(p->vTimes3,p->pTimes[(uint)pAVar5->Id].rise);
      Vec_FltPush(p->vTimes3,p->pTimes[(uint)pAVar5->Id].fall);
    }
  }
  p->vLoads2->nSize = 0;
  for (lVar8 = 0; lVar8 < (pObj->vFanins).nSize; lVar8 = lVar8 + 1) {
    pvVar2 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar8]];
    Vec_FltPush(p->vLoads2,p->pLoads[*(uint *)((long)pvVar2 + 0x10)].rise);
    Vec_FltPush(p->vLoads2,p->pLoads[*(uint *)((long)pvVar2 + 0x10)].fall);
  }
  local_6c = (float)-DelayGap;
  local_68 = -1;
  iVar3 = 0;
  iVar6 = 0;
  for (pCell = pOld; pCell != pOld || iVar3 == 0; pCell = pCell->pNext) {
    if (pCell != pOld) {
      if (Notches < iVar3) break;
      Abc_SclObjSetCell(pObj,pCell);
      Abc_SclUpdateLoad(p,pObj,pOld,pCell);
      Abc_SclTimeCone(p,vRecalcs);
      Abc_SclObjSetCell(pObj,pOld);
      iVar7 = 0;
      for (lVar8 = 0; lVar8 < (pObj->vFanins).nSize; lVar8 = lVar8 + 1) {
        pvVar2 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar8]];
        iVar9 = iVar7 + 1;
        fVar10 = Vec_FltEntry(p->vLoads2,iVar7);
        p->pLoads[*(uint *)((long)pvVar2 + 0x10)].rise = fVar10;
        iVar7 = iVar7 + 2;
        fVar10 = Vec_FltEntry(p->vLoads2,iVar9);
        p->pLoads[*(uint *)((long)pvVar2 + 0x10)].fall = fVar10;
      }
      if (p->vLoads2->nSize != iVar7) {
        __assert_fail("Vec_FltSize(p->vLoads2) == k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.h"
                      ,0x136,"void Abc_SclLoadRestore(SC_Man *, Abc_Obj_t *)");
      }
      fVar10 = 0.0;
      iVar7 = 0;
      for (iVar9 = 0; iVar9 < vEvals->nSize; iVar9 = iVar9 + 1) {
        pAVar1 = p->pNtk;
        iVar4 = Vec_IntEntry(vEvals,iVar9);
        pAVar5 = Abc_NtkObj(pAVar1,iVar4);
        if (pAVar5 != (Abc_Obj_t *)0x0) {
          iVar4 = iVar7 + 1;
          fVar11 = Vec_FltEntry(p->vTimes3,iVar7);
          fVar13 = p->pTimes[(uint)pAVar5->Id].rise;
          iVar7 = iVar7 + 2;
          fVar12 = Vec_FltEntry(p->vTimes3,iVar4);
          fVar13 = (fVar12 - p->pTimes[(uint)pAVar5->Id].fall) + (fVar11 - fVar13);
          fVar10 = (float)(~-(uint)(0.0 < fVar13) & (uint)(fVar13 * 1.5) |
                          (uint)fVar13 & -(uint)(0.0 < fVar13)) * 0.5 + fVar10;
        }
      }
      if (p->vTimes3->nSize != iVar7) {
        __assert_fail("Vec_FltSize(p->vTimes3) == k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.h"
                      ,0x183,"float Abc_SclEvalPerform(SC_Man *, Vec_Int_t *)");
      }
      fVar10 = fVar10 / (float)vEvals->nSize;
      if (local_6c < fVar10) {
        local_68 = pCell->Id;
        iVar6 = 1;
        local_6c = fVar10;
      }
      else if (iVar6 == 0) {
        iVar6 = 0;
      }
      else {
        iVar6 = iVar6 + 1;
        if (iVar6 == 4) break;
      }
    }
    iVar3 = iVar3 + 1;
  }
  Abc_SclObjSetCell(pObj,pOld);
  iVar6 = 0;
  for (iVar3 = 0; iVar3 < vRecalcs->nSize; iVar3 = iVar3 + 1) {
    pAVar1 = p->pNtk;
    iVar7 = Vec_IntEntry(vRecalcs,iVar3);
    pAVar5 = Abc_NtkObj(pAVar1,iVar7);
    if (pAVar5 != (Abc_Obj_t *)0x0) {
      fVar10 = Vec_FltEntry(p->vTimes2,iVar6);
      p->pTimes[(uint)pAVar5->Id].rise = fVar10;
      fVar10 = Vec_FltEntry(p->vTimes2,iVar6 + 1);
      p->pTimes[(uint)pAVar5->Id].fall = fVar10;
      iVar7 = iVar6 + 3;
      fVar10 = Vec_FltEntry(p->vTimes2,iVar6 + 2);
      p->pSlews[(uint)pAVar5->Id].rise = fVar10;
      iVar6 = iVar6 + 4;
      fVar10 = Vec_FltEntry(p->vTimes2,iVar7);
      p->pSlews[(uint)pAVar5->Id].fall = fVar10;
    }
  }
  if (p->vTimes2->nSize != iVar6) {
    __assert_fail("Vec_FltSize(p->vTimes2) == k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.h"
                  ,0x16b,"void Abc_SclConeRestore(SC_Man *, Vec_Int_t *)");
  }
  *pGainBest = local_6c;
  return local_68;
}

Assistant:

int Abc_SclFindBestCell( SC_Man * p, Abc_Obj_t * pObj, Vec_Int_t * vRecalcs, Vec_Int_t * vEvals, int Notches, int DelayGap, float * pGainBest )
{
    SC_Cell * pCellOld, * pCellNew;
    float dGain, dGainBest;
    int k, gateBest, NoChange = 0;
    // save old gate, timing, fanin load
    pCellOld = Abc_SclObjCell( pObj );
    Abc_SclConeStore( p, vRecalcs );
    Abc_SclEvalStore( p, vEvals );
    Abc_SclLoadStore( p, pObj );
    // try different gate sizes for this node
    gateBest = -1;
    dGainBest = -DelayGap;
    SC_RingForEachCell( pCellOld, pCellNew, k )
    {
        if ( pCellNew == pCellOld )
            continue;
        if ( k > Notches )
            break;
        // set new cell
        Abc_SclObjSetCell( pObj, pCellNew );
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        // recompute timing
        Abc_SclTimeCone( p, vRecalcs );
        // set old cell
        Abc_SclObjSetCell( pObj, pCellOld );
        Abc_SclLoadRestore( p, pObj );
        // save best gain
        dGain = Abc_SclEvalPerform( p, vEvals );
        if ( dGainBest < dGain )
        {
            dGainBest = dGain;
            gateBest = pCellNew->Id;
            NoChange = 1;
        }
        else if ( NoChange )
            NoChange++;
        if ( NoChange == 4 )
            break;
//        printf( "%.2f ", dGain );
    }
//    printf( "Best = %.2f   ", dGainBest );
//    printf( "\n" );
    // put back old cell and timing
    Abc_SclObjSetCell( pObj, pCellOld );
    Abc_SclConeRestore( p, vRecalcs );
    *pGainBest = dGainBest;
    return gateBest;
}